

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_teamcity.hpp
# Opt level: O3

void __thiscall
Catch::TeamCityReporter::testGroupStarting(TeamCityReporter *this,GroupInfo *groupInfo)

{
  ostream *poVar1;
  string local_38;
  
  Option<Catch::GroupInfo>::operator=
            (&(this->super_StreamingReporterBase<Catch::TeamCityReporter>).currentGroupInfo.
              super_Option<Catch::GroupInfo>,groupInfo);
  (this->super_StreamingReporterBase<Catch::TeamCityReporter>).currentGroupInfo.used = false;
  poVar1 = (this->super_StreamingReporterBase<Catch::TeamCityReporter>).stream;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"##teamcity[testSuiteStarted name=\'",0x22);
  escape(&local_38,&groupInfo->name);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\']\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void testGroupStarting( GroupInfo const& groupInfo ) override {
            StreamingReporterBase::testGroupStarting( groupInfo );
            stream << "##teamcity[testSuiteStarted name='"
                << escape( groupInfo.name ) << "']\n";
        }